

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

wchar_t compare_coord_dist(void *p1,void *p2)

{
  int iVar1;
  int iVar2;
  wchar_t dist2;
  wchar_t dist1;
  wchar_t dy;
  wchar_t dx;
  coord *c2;
  coord *c1;
  void *p2_local;
  void *p1_local;
  
  iVar1 = player.y - *(int *)((long)p1 + 4);
  iVar2 = player.y - *(int *)((long)p2 + 4);
  return ((player.x - *p1) * (player.x - *p1) + iVar1 * iVar1) -
         ((player.x - *p2) * (player.x - *p2) + iVar2 * iVar2);
}

Assistant:

static int compare_coord_dist(const void *p1, const void *p2)
{
    const struct coord *c1 = p1;
    const struct coord *c2 = p2;
    int dx, dy, dist1, dist2;
    
    dx = player.x - c1->x; dy = player.y - c1->y;
    dist1 = dx * dx + dy * dy;
    dx = player.x - c2->x; dy = player.y - c2->y;
    dist2 = dx * dx + dy * dy;
    
    return dist1 - dist2;
}